

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_codepoint<2ul,char,fmt::v9::appender>
                   (appender out,char prefix,uint32_t cp)

{
  back_insert_iterator<fmt::v9::detail::buffer<char>_> out_00;
  appender aVar1;
  uint in_EDX;
  undefined1 in_SIL;
  buffer<char> *in_RDI;
  char buf [2];
  value_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffc7;
  undefined7 in_stack_ffffffffffffffd0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_28;
  undefined1 local_19;
  uint local_18;
  undefined1 local_11;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10 [2];
  
  local_19 = 0x5c;
  local_18 = in_EDX;
  local_11 = in_SIL;
  local_10[0].container = in_RDI;
  local_28.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_28);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  out_00.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)&stack0xffffffffffffffc8);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  fill_n<char,unsigned_long>
            ((char *)CONCAT17(local_11,in_stack_ffffffffffffffd0),(unsigned_long)out_00.container,
             in_stack_ffffffffffffffc7);
  format_uint<4u,char,unsigned_int>(&stack0xffffffffffffffc6,local_18,2,false);
  aVar1 = copy_str<char,char*>
                    ((char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     (char *)local_10[0].container,(appender)out_00.container);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}